

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::
optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>>
::
initialize<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>>
          (optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>>
           *this,Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                 *value)

{
  if (*this != (optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>>
                )0x1) {
    tinyusdz::
    Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
    ::Animatable((Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                  *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>>
             )0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f>>>::initialize(V &&) [T = tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f>>, V = tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f>>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }